

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder.h
# Opt level: O2

NodeRef __thiscall
embree::sse2::BVHNBuilderVirtual<4>::
BVHNBuilderT<embree::sse2::CreateLeaf<4,_embree::InstancePrimitive>_>::createLeaf
          (BVHNBuilderT<embree::sse2::CreateLeaf<4,_embree::InstancePrimitive>_> *this,
          PrimRef *prims,range<unsigned_long> *set,Allocator *alloc)

{
  atomic<unsigned_long> *paVar1;
  uint uVar2;
  unsigned_long uVar3;
  FastAllocator *this_00;
  ThreadLocal *pTVar4;
  ThreadLocal2 *this_01;
  MutexSys *pMVar5;
  MutexSys *pMVar6;
  char *pcVar7;
  size_t sVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  bool bVar13;
  Lock<embree::MutexSys> local_60;
  MutexSys *local_50;
  Lock<embree::MutexSys> local_48;
  ThreadLocal2 *local_38;
  
  uVar3 = set->_begin;
  uVar12 = set->_end - uVar3;
  local_50 = (MutexSys *)(uVar12 * 0x10);
  this_00 = alloc->alloc;
  pTVar4 = alloc->talloc1;
  this_01 = pTVar4->parent;
  if (this_00 != (this_01->alloc)._M_b._M_p) {
    local_48.locked = true;
    local_48.mutex = &this_01->mutex;
    MutexSys::lock(&this_01->mutex);
    if ((this_01->alloc)._M_b._M_p != (__pointer_type)0x0) {
      LOCK();
      paVar1 = &((this_01->alloc)._M_b._M_p)->bytesUsed;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (this_01->alloc1).bytesUsed + (this_01->alloc0).bytesUsed;
      UNLOCK();
      LOCK();
      paVar1 = &((this_01->alloc)._M_b._M_p)->bytesFree;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (((this_01->alloc0).end + (this_01->alloc1).end) -
           ((this_01->alloc0).cur + (this_01->alloc1).cur));
      UNLOCK();
      LOCK();
      paVar1 = &((this_01->alloc)._M_b._M_p)->bytesWasted;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (this_01->alloc1).bytesWasted + (this_01->alloc0).bytesWasted;
      UNLOCK();
    }
    (this_01->alloc0).bytesUsed = 0;
    (this_01->alloc0).bytesWasted = 0;
    (this_01->alloc0).end = 0;
    (this_01->alloc0).allocBlockSize = 0;
    (this_01->alloc0).ptr = (char *)0x0;
    (this_01->alloc0).cur = 0;
    if (this_00 == (FastAllocator *)0x0) {
      (this_01->alloc1).bytesUsed = 0;
      (this_01->alloc1).bytesWasted = 0;
      (this_01->alloc1).end = 0;
      (this_01->alloc1).allocBlockSize = 0;
      (this_01->alloc1).ptr = (char *)0x0;
      (this_01->alloc1).cur = 0;
    }
    else {
      (this_01->alloc0).allocBlockSize = this_00->defaultBlockSize;
      (this_01->alloc1).ptr = (char *)0x0;
      (this_01->alloc1).cur = 0;
      (this_01->alloc1).end = 0;
      (this_01->alloc1).allocBlockSize = 0;
      (this_01->alloc1).bytesUsed = 0;
      (this_01->alloc1).bytesWasted = 0;
      (this_01->alloc1).allocBlockSize = this_00->defaultBlockSize;
    }
    LOCK();
    (this_01->alloc)._M_b._M_p = this_00;
    UNLOCK();
    local_60.mutex = (MutexSys *)&FastAllocator::s_thread_local_allocators_lock;
    local_60.locked = true;
    local_38 = this_01;
    MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
    std::
    vector<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
    ::push_back(&this_00->thread_local_allocators,&local_38);
    Lock<embree::MutexSys>::~Lock(&local_60);
    Lock<embree::MutexSys>::~Lock(&local_48);
  }
  pMVar6 = local_50;
  pTVar4->bytesUsed = (long)&local_50->mutex + pTVar4->bytesUsed;
  sVar8 = pTVar4->cur;
  uVar9 = (ulong)(-(int)sVar8 & 0xf);
  uVar11 = (long)&local_50->mutex + uVar9 + sVar8;
  pTVar4->cur = uVar11;
  if (pTVar4->end < uVar11) {
    pTVar4->cur = sVar8;
    pMVar5 = (MutexSys *)pTVar4->allocBlockSize;
    if ((MutexSys *)((long)local_50 * 4) < pMVar5 || (long)local_50 * 4 - (long)pMVar5 == 0) {
      local_60.mutex = pMVar5;
      pcVar7 = (char *)FastAllocator::malloc(this_00,(size_t)&local_60);
      pTVar4->ptr = pcVar7;
      sVar8 = (pTVar4->end - pTVar4->cur) + pTVar4->bytesWasted;
      pTVar4->bytesWasted = sVar8;
      pTVar4->end = (size_t)local_60.mutex;
      pTVar4->cur = (size_t)pMVar6;
      if (local_60.mutex < pMVar6) {
        pTVar4->cur = 0;
        local_60.mutex = (MutexSys *)pTVar4->allocBlockSize;
        pcVar7 = (char *)FastAllocator::malloc(this_00,(size_t)&local_60);
        pTVar4->ptr = pcVar7;
        sVar8 = (pTVar4->end - pTVar4->cur) + pTVar4->bytesWasted;
        pTVar4->bytesWasted = sVar8;
        pTVar4->end = (size_t)local_60.mutex;
        pTVar4->cur = (size_t)pMVar6;
        if (local_60.mutex < pMVar6) {
          pTVar4->cur = 0;
          pcVar7 = (char *)0x0;
          goto LAB_004763f0;
        }
      }
      pTVar4->bytesWasted = sVar8;
    }
    else {
      pcVar7 = (char *)FastAllocator::malloc(this_00,(size_t)&local_50);
    }
  }
  else {
    pTVar4->bytesWasted = pTVar4->bytesWasted + uVar9;
    pcVar7 = pTVar4->ptr + (uVar11 - (long)local_50);
  }
LAB_004763f0:
  lVar10 = 0;
  uVar11 = uVar12;
  while (bVar13 = uVar11 != 0, uVar11 = uVar11 - 1, bVar13) {
    uVar2 = *(uint *)((long)&prims[uVar3].lower.field_0 + lVar10 * 2 + 0xc);
    *(Geometry **)(pcVar7 + lVar10) =
         (((this->createLeafFunc).bvh)->scene->geometries).items[uVar2].ptr;
    *(uint *)(pcVar7 + lVar10 + 8) = uVar2;
    lVar10 = lVar10 + 0x10;
  }
  uVar11 = 7;
  if (uVar12 < 7) {
    uVar11 = uVar12;
  }
  return (NodeRef)(uVar11 | (ulong)pcVar7 | 8);
}

Assistant:

NodeRef createLeaf (const PrimRef* prims, const range<size_t>& set, const Allocator& alloc) {
            return createLeafFunc(prims,set,alloc);
          }